

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O3

size_t __thiscall ON_FixedSizePool::ElementIndex(ON_FixedSizePool *this,void *element_pointer)

{
  ulong uVar1;
  void **ppvVar2;
  long lVar3;
  char *sFormat;
  undefined8 *puVar4;
  int line_number;
  undefined8 *puVar5;
  
  if (element_pointer != (void *)0x0) {
    if ((undefined8 *)this->m_first_block != (undefined8 *)0x0) {
      uVar1 = this->m_sizeof_element;
      lVar3 = 0;
      puVar4 = (undefined8 *)this->m_first_block;
      do {
        if (puVar4 == (undefined8 *)this->m_al_block) {
          puVar5 = (undefined8 *)0x0;
          ppvVar2 = &this->m_al_element_array;
        }
        else {
          puVar5 = (undefined8 *)*puVar4;
          ppvVar2 = (void **)(puVar4 + 1);
        }
        puVar4 = puVar4 + 2;
        if (element_pointer < *ppvVar2 && puVar4 <= element_pointer) {
          if ((ulong)((long)element_pointer - (long)puVar4) % uVar1 == 0) {
            return ((ulong)((long)element_pointer - (long)puVar4) / uVar1 & 0xffffffff) + lVar3;
          }
          sFormat = "element_pointer is offset into an fsp element.";
          line_number = 0x356;
          goto LAB_0048c2d4;
        }
        lVar3 = lVar3 + (ulong)((long)*ppvVar2 - (long)puVar4) / uVar1;
        puVar4 = puVar5;
      } while (puVar5 != (undefined8 *)0x0);
    }
    sFormat = "element_pointer is not in allocated fsp memory.";
    line_number = 0x35d;
LAB_0048c2d4:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
               ,line_number,"",sFormat);
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t ON_FixedSizePool::ElementIndex(const void* element_pointer) const
{
  if (nullptr != element_pointer)
  {
    const char* block;
    const char* block_end;
    const char* next_block;
    size_t block_count;
    const char* ptr = (const char*)element_pointer;
    size_t ptr_index = 0;
    for (block = (const char*)m_first_block; 0 != block; block = next_block)
    {
      if (block == m_al_block)
      {
        // After a ReturnAll(), a multi-block fsp has unused blocks after m_al_block.
        // Searching must terminate at m_al_block.
        next_block = nullptr;
        block_end = (const char*)m_al_element_array;
        block += (2 * sizeof(void*));
      }
      else
      {
        next_block = *((const char**)block);
        block += sizeof(void*);
        block_end = *((const char**)(block));
        block += sizeof(void*);
      }
      if (ptr >= block && ptr < block_end)
      {
        size_t offset = ptr - block;
        if (0 == offset % m_sizeof_element)
        {
          ptr_index += (unsigned int)(offset/m_sizeof_element);
          return ptr_index;
        }
        // Caller is confused
        ON_ERROR("element_pointer is offset into an fsp element.");
        return ON_MAX_SIZE_T;
      }
      block_count = (block_end - block) / m_sizeof_element;
      ptr_index += block_count;
    }
    // Caller is confused
    ON_ERROR("element_pointer is not in allocated fsp memory.");
    return ON_MAX_SIZE_T;
  }

  return ON_MAX_SIZE_T;
}